

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O2

void __thiscall
DConversationMenu::DConversationMenu(DConversationMenu *this,FStrifeDialogueNode *CurNode)

{
  ulong uVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  BYTE *__s1;
  FBrokenLines *pFVar5;
  char *pcVar6;
  char *pcVar7;
  BYTE *string;
  FStrifeDialogueReply *pFVar8;
  FString *item;
  FString local_68;
  TArray<unsigned_int,_unsigned_int> *local_60;
  char goodbye [25];
  
  DMenu::DMenu(&this->super_DMenu,(DMenu *)0x0);
  (this->super_DMenu).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_007caf10;
  (this->mSpeaker).Chars = FString::NullString.Nothing;
  iVar4 = FString::NullString.RefCount;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  (this->mResponses).Array = (uint *)0x0;
  (this->mResponses).Most = 0;
  (this->mResponses).Count = 0;
  (this->mResponseLines).Array = (FString *)0x0;
  (this->mResponseLines).Most = 0;
  (this->mResponseLines).Count = 0;
  this->mCurNode = CurNode;
  this->mDialogueLines = (FBrokenLines *)0x0;
  local_60 = &this->mResponses;
  this->mShowGold = false;
  __s1 = (BYTE *)CurNode->Dialogue;
  iVar3 = strncmp((char *)__s1,"RANDOM_",7);
  if (iVar3 == 0) {
    goodbye[0] = -0x44;
    goodbye[1] = -0xf;
    goodbye[2] = '\x7f';
    goodbye[3] = '\0';
    goodbye[4] = '\0';
    goodbye[5] = '\0';
    goodbye[6] = '\0';
    goodbye[7] = '\0';
    FString::NullString.RefCount = iVar4 + 2;
    iVar4 = FRandom::operator()(&pr_randomspeech);
    FString::Format((FString *)goodbye,"TXT_%s_%02d",__s1,(ulong)(iVar4 % 10 + 1));
    __s1 = (BYTE *)FStringTable::operator[](&GStrings,(char *)goodbye._0_8_);
    if (__s1 == (BYTE *)0x0) {
      __s1 = (BYTE *)FStringTable::operator[](&GStrings,"TXT_GOAWAY");
    }
    FString::~FString((FString *)goodbye);
  }
  else if (*__s1 == '$') {
    __s1 = (BYTE *)FStringTable::operator()(&GStrings,(char *)(__s1 + 1));
  }
  string = ".";
  if (__s1 != (BYTE *)0x0) {
    string = __s1;
  }
  pFVar5 = V_BreakLines(SmallFont,
                        (screen->super_DSimpleCanvas).super_DCanvas.Width / CleanXfac + -0x30,string
                        ,false);
  this->mDialogueLines = pFVar5;
  pFVar8 = (FStrifeDialogueReply *)&CurNode->Children;
  while (pFVar8 = pFVar8->Next, pFVar8 != (FStrifeDialogueReply *)0x0) {
    pcVar6 = pFVar8->Reply;
    if (pcVar6 != (char *)0x0) {
      this->mShowGold = (bool)(this->mShowGold | pFVar8->NeedsGold);
      if (*pcVar6 == '$') {
        pcVar6 = FStringTable::operator()(&GStrings,pcVar6 + 1);
      }
      FString::FString((FString *)goodbye,pcVar6);
      if (pFVar8->NeedsGold == true) {
        FString::AppendFormat
                  ((FString *)goodbye," for %u",(ulong)(uint)((pFVar8->ItemCheck).Array)->Amount);
      }
      pFVar5 = V_BreakLines(SmallFont,0x104,(BYTE *)goodbye._0_8_,false);
      local_68.Chars._0_4_ = (this->mResponseLines).Count;
      TArray<unsigned_int,_unsigned_int>::Push(local_60,(uint *)&local_68);
      for (item = &pFVar5->Text; -1 < ((FBrokenLines *)(item + -1))->Width; item = item + 2) {
        TArray<FString,_FString>::Push(&this->mResponseLines,item);
      }
      V_FreeBrokenLines(pFVar5);
      FString::~FString((FString *)goodbye);
    }
  }
  iVar4 = FRandom::operator()(&pr_randomspeech);
  mysnprintf(goodbye,0x19,"TXT_RANDOMGOODBYE_%d",(ulong)(iVar4 % 3 + 1));
  pcVar7 = FStringTable::operator[](&GStrings,goodbye);
  local_68.Chars._0_4_ = (this->mResponseLines).Count;
  TArray<unsigned_int,_unsigned_int>::Push(local_60,(uint *)&local_68);
  pcVar6 = "Bye.";
  if (pcVar7 != (char *)0x0) {
    pcVar6 = pcVar7;
  }
  FString::FString(&local_68,pcVar6);
  TArray<FString,_FString>::Push(&this->mResponseLines,&local_68);
  FString::~FString(&local_68);
  ConversationMenuY = 0xc0 - (this->mResponseLines).Count * OptionSettings.mLinespacing;
  if (0x8b < ConversationMenuY) {
    ConversationMenuY = 0x8c;
  }
  this->mYpos = ConversationMenuY;
  pFVar5 = this->mDialogueLines;
  iVar4 = 0x86;
  do {
    iVar4 = iVar4 + 10;
    piVar2 = &pFVar5->Width;
    pFVar5 = pFVar5 + 1;
  } while (-1 < *piVar2);
  uVar1 = (long)(screen->super_DSimpleCanvas).super_DCanvas.Height / (long)CleanYfac;
  iVar3 = (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) / -2);
  if (ConversationMenuY + -100 < iVar3 + iVar4 + -100) {
    ConversationMenuY = iVar3 + iVar4;
    this->mYpos = ConversationMenuY;
  }
  return;
}

Assistant:

DConversationMenu(FStrifeDialogueNode *CurNode) 
	{
		mCurNode = CurNode;
		mDialogueLines = NULL;
		mShowGold = false;

		// Format the speaker's message.
		const char * toSay = CurNode->Dialogue;
		if (strncmp (toSay, "RANDOM_", 7) == 0)
		{
			FString dlgtext;

			dlgtext.Format("TXT_%s_%02d", toSay, 1+(pr_randomspeech() % NUM_RANDOM_LINES));
			toSay = GStrings[dlgtext];
			if (toSay == NULL)
			{
				toSay = GStrings["TXT_GOAWAY"];	// Ok, it's lame - but it doesn't look like an error to the player. ;)
			}
		}
		else
		{
			// handle string table replacement
			if (toSay[0] == '$')
			{
				toSay = GStrings(toSay + 1);
			}
		}
		if (toSay == NULL)
		{
			toSay = ".";
		}
		mDialogueLines = V_BreakLines (SmallFont, screen->GetWidth()/CleanXfac - 24*2, toSay);

		FStrifeDialogueReply *reply;
		int i,j;
		for (reply = CurNode->Children, i = 1; reply != NULL; reply = reply->Next)
		{
			if (reply->Reply == NULL)
			{
				continue;
			}
			mShowGold |= reply->NeedsGold;

			const char *ReplyText = reply->Reply;
			if (ReplyText[0] == '$')
			{
				ReplyText = GStrings(ReplyText + 1);
			}
			FString ReplyString = ReplyText;
			if (reply->NeedsGold) ReplyString.AppendFormat(" for %u", reply->ItemCheck[0].Amount);

			FBrokenLines *ReplyLines = V_BreakLines (SmallFont, 320-50-10, ReplyString);

			mResponses.Push(mResponseLines.Size());
			for (j = 0; ReplyLines[j].Width >= 0; ++j)
			{
				mResponseLines.Push(ReplyLines[j].Text);
			}
			++i;
			V_FreeBrokenLines (ReplyLines);
		}
		char goodbye[25];
		mysnprintf(goodbye, countof(goodbye), "TXT_RANDOMGOODBYE_%d", 1+(pr_randomspeech() % NUM_RANDOM_GOODBYES));
		const char *goodbyestr = GStrings[goodbye];
		if (goodbyestr == NULL) goodbyestr = "Bye.";
		mResponses.Push(mResponseLines.Size());
		mResponseLines.Push(FString(goodbyestr));

		// Determine where the top of the reply list should be positioned.
		i = OptionSettings.mLinespacing;
		mYpos = MIN<int> (140, 192 - mResponseLines.Size() * i);
		for (i = 0; mDialogueLines[i].Width >= 0; ++i)
		{ }
		i = 44 + i * 10;
		if (mYpos - 100 < i - screen->GetHeight() / CleanYfac / 2)
		{
			mYpos = i - screen->GetHeight() / CleanYfac / 2 + 100;
		}
		ConversationMenuY = mYpos;
		//ConversationMenu.indent = 50;
	}